

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameinput.cpp
# Opt level: O3

void __thiscall
gamespace::GameScreenInputState::GameScreenInputState
          (GameScreenInputState *this,GameScreenImpl *impl)

{
  this->_mouse_mode = FREE;
  this->_resy = (double)impl->_ctxt->_h;
  this->_impl = impl;
  this->_movementmask[0] = false;
  this->_movementmask[1] = false;
  this->_movementmask[2] = false;
  this->_movementmask[3] = false;
  this->_movementmask[4] = false;
  this->_movementmask[5] = false;
  return;
}

Assistant:

GameScreenInputState::GameScreenInputState(GameScreenImpl &impl): _mouse_mode(FREE), _resy(impl.context()->getResolution().y), _impl(&impl) {
    _movementmask[0] = false;
    _movementmask[1] = false;
    _movementmask[2] = false;
    _movementmask[3] = false;
    _movementmask[4] = false;
    _movementmask[5] = false;
}